

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall
QMainWindowLayout::setCurrentHoveredFloat(QMainWindowLayout *this,QDockWidgetGroupWindow *w)

{
  long lVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined4 *puVar4;
  QDockWidgetGroupWindow *pQVar5;
  QObject *pQVar6;
  QObject *pQVar7;
  long in_FS_OFFSET;
  Connection local_68;
  QObject local_60 [8];
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x7f0);
  if ((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) {
    pQVar5 = (QDockWidgetGroupWindow *)0x0;
  }
  else {
    pQVar5 = *(QDockWidgetGroupWindow **)(this + 0x7f8);
  }
  if (pQVar5 != w) {
    if (((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) || (*(long *)(this + 0x7f8) == 0)) {
      if (w != (QDockWidgetGroupWindow *)0x0) {
        restore(this,true);
      }
    }
    else {
      if ((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) {
        pQVar6 = (QObject *)0x0;
      }
      else {
        pQVar6 = *(QObject **)(this + 0x7f8);
      }
      local_48 = QObject::destroyed;
      pQVar7 = (QObject *)0x0;
      local_40 = 0;
      local_58 = updateGapIndicator;
      local_50 = (ImplFn)0x0;
      QObject::disconnectImpl
                (pQVar6,&local_48,(QObject *)this,&local_58,
                 (QMetaObject *)&QObject::staticMetaObject);
      if (*(long *)(this + 0x7f0) != 0) {
        if (*(int *)(*(long *)(this + 0x7f0) + 4) == 0) {
          pQVar7 = (QObject *)0x0;
        }
        else {
          pQVar7 = *(QObject **)(this + 0x7f8);
        }
      }
      local_48 = QDockWidgetGroupWindow::resized;
      local_40 = 0;
      local_58 = updateGapIndicator;
      local_50 = (ImplFn)0x0;
      QObject::disconnectImpl
                (pQVar7,&local_48,(QObject *)this,&local_58,
                 &QDockWidgetGroupWindow::staticMetaObject);
      if (((*(long *)(this + 0x7f0) != 0) && (*(int *)(*(long *)(this + 0x7f0) + 4) != 0)) &&
         (*(long *)(this + 0x7f8) != 0)) {
        QDockWidgetGroupWindow::restore(*(QDockWidgetGroupWindow **)(this + 0x7f8));
      }
    }
    if (w == (QDockWidgetGroupWindow *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)w);
    }
    piVar2 = *(int **)(this + 0x7f0);
    *(undefined8 *)(this + 0x7f0) = uVar3;
    *(QDockWidgetGroupWindow **)(this + 0x7f8) = w;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        operator_delete(piVar2);
      }
    }
    if (w != (QDockWidgetGroupWindow *)0x0) {
      local_58 = updateGapIndicator;
      local_50 = (ImplFn)0x0;
      local_48 = QObject::destroyed;
      local_40 = 0;
      puVar4 = (undefined4 *)operator_new(0x20);
      *puVar4 = 1;
      *(code **)(puVar4 + 2) =
           QtPrivate::QCallableObject<void_(QMainWindowLayout::*)(),_QtPrivate::List<>,_void>::impl;
      *(code **)(puVar4 + 4) = updateGapIndicator;
      *(undefined8 *)(puVar4 + 6) = 0;
      QObject::connectImpl
                (local_60,(void **)w,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)&local_58
                 ,(ConnectionType)puVar4,(int *)0x80,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_60);
      local_58 = updateGapIndicator;
      local_50 = (ImplFn)0x0;
      local_48 = QDockWidgetGroupWindow::resized;
      local_40 = 0;
      puVar4 = (undefined4 *)operator_new(0x20);
      *puVar4 = 1;
      *(code **)(puVar4 + 2) =
           QtPrivate::QCallableObject<void_(QMainWindowLayout::*)(),_QtPrivate::List<>,_void>::impl;
      *(code **)(puVar4 + 4) = updateGapIndicator;
      *(undefined8 *)(puVar4 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_68,(void **)w,(QObject *)&local_48,(void **)this,
                 (QSlotObjectBase *)&local_58,(ConnectionType)puVar4,(int *)0x80,(QMetaObject *)0x0)
      ;
      QMetaObject::Connection::~Connection(&local_68);
    }
    updateGapIndicator(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::setCurrentHoveredFloat(QDockWidgetGroupWindow *w)
{
    if (currentHoveredFloat != w) {
        if (currentHoveredFloat) {
            disconnect(currentHoveredFloat.data(), &QObject::destroyed,
                       this, &QMainWindowLayout::updateGapIndicator);
            disconnect(currentHoveredFloat.data(), &QDockWidgetGroupWindow::resized,
                       this, &QMainWindowLayout::updateGapIndicator);
            if (currentHoveredFloat)
                currentHoveredFloat->restore();
        } else if (w) {
            restore(true);
        }

        currentHoveredFloat = w;

        if (w) {
            connect(w, &QObject::destroyed,
                    this, &QMainWindowLayout::updateGapIndicator, Qt::UniqueConnection);
            connect(w, &QDockWidgetGroupWindow::resized,
                    this, &QMainWindowLayout::updateGapIndicator, Qt::UniqueConnection);
        }

        updateGapIndicator();
    }
}